

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O2

int __thiscall QButtonGroup::checkedId(QButtonGroup *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_14;
  QAbstractButton *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if ((*(long *)(lVar1 + 0x90) == 0) || (*(int *)(*(long *)(lVar1 + 0x90) + 4) == 0)) {
    local_10 = (QAbstractButton *)0x0;
  }
  else {
    local_10 = *(QAbstractButton **)(lVar1 + 0x98);
  }
  local_14 = -1;
  iVar2 = QHash<QAbstractButton_*,_int>::value
                    ((QHash<QAbstractButton_*,_int> *)(lVar1 + 0xa8),&local_10,&local_14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::checkedId() const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(d->checkedButton, -1);
}